

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *pcVar1;
  ulong uVar2;
  string *in_RDI;
  allocator local_35 [19];
  byte local_22;
  allocator local_21;
  char *local_20;
  char *colon;
  char *gtest_output_flag;
  
  colon = (char *)std::__cxx11::string::c_str();
  local_20 = strchr(colon,0x3a);
  pcVar1 = colon;
  local_22 = 0;
  if (local_20 == (char *)0x0) {
    std::allocator<char>::allocator();
    local_22 = 1;
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_21);
  }
  else {
    uVar2 = (long)local_20 - (long)colon;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,uVar2,local_35);
    std::allocator<char>::~allocator((allocator<char> *)local_35);
  }
  if ((local_22 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == nullptr)
             ? std::string(gtest_output_flag)
             : std::string(gtest_output_flag,
                           static_cast<size_t>(colon - gtest_output_flag));
}